

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  EnumValueOptions *this_00;
  LocationRecorder location;
  LocationRecorder local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  bVar1 = true;
  if (iVar2 == 0) {
    LocationRecorder::LocationRecorder(&local_40,enum_value_location,3);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        *(byte *)(value->_has_bits_).has_bits_ = (byte)(value->_has_bits_).has_bits_[0] | 2;
        if (value->options_ == (EnumValueOptions *)0x0) {
          this_00 = (EnumValueOptions *)operator_new(0x70);
          EnumValueOptions::EnumValueOptions(this_00);
          value->options_ = this_00;
        }
        bVar1 = ParseOption(this,&value->options_->super_Message,&local_40,containing_file,
                            OPTION_ASSIGNMENT);
        if (!bVar1) goto LAB_002d366b;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar1 = Consume(this,"]");
    }
    else {
LAB_002d366b:
      bVar1 = false;
    }
    LocationRecorder::~LocationRecorder(&local_40);
  }
  return bVar1;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(
      enum_value_location, EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location,
                   containing_file, OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}